

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O1

TriangleMesh *
pbrt::LoopSubdivide(Transform *renderFromObject,bool reverseOrientation,int nLevels,
                   span<const_int> vertexIndices,span<const_pbrt::Point3<float>_> p,Allocator alloc)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  _Rb_tree_color _Var39;
  _func_int *p_Var40;
  mapped_type pSVar41;
  undefined1 auVar42 [16];
  pointer ppSVar43;
  pointer ppSVar44;
  pointer ppSVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  _func_int **pp_Var49;
  _func_int **pp_Var50;
  iterator iVar51;
  memory_resource *pmVar52;
  SDVertex *pSVar53;
  undefined1 (*pauVar54) [64];
  mapped_type *ppSVar55;
  undefined4 extraout_var_01;
  SDVertex *pSVar56;
  long lVar57;
  SDFace *pSVar58;
  SDFace *pSVar59;
  mapped_type *pmVar60;
  float *pfVar61;
  undefined4 extraout_var_02;
  int *piVar62;
  long lVar63;
  size_t sVar64;
  ulong uVar65;
  pointer ppSVar66;
  pointer ppSVar67;
  pointer ppSVar68;
  int v0;
  uint uVar69;
  SDFace *pSVar70;
  ulong uVar71;
  size_type __n;
  long lVar72;
  ulong uVar73;
  long lVar74;
  _func_int **pp_Var75;
  bool bVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar95 [56];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar107 [60];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  pair<std::_Rb_tree_iterator<pbrt::SDEdge>,_std::_Rb_tree_iterator<pbrt::SDEdge>_> pVar111;
  Point3f PVar112;
  bool reverseOrientation_local;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> pRing;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> v;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> Ns;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> f;
  undefined1 local_228 [16];
  SDVertex *vert;
  pointer local_1f8;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> pLimit;
  map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
  edgeVerts;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> faces;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> vertices;
  Allocator alloc_local;
  monotonic_buffer_resource resource;
  vector<int,_std::allocator<int>_> local_d8;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_a8;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> local_88;
  Transform *local_68;
  set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_> edges;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 extraout_var_03 [60];
  
  uVar71 = vertexIndices.n;
  piVar62 = vertexIndices.ptr;
  vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = p.n;
  uVar65 = 0xffffffffffffffff;
  if (SUB168(auVar79 * ZEXT816(0x28),8) == 0) {
    uVar65 = SUB168(auVar79 * ZEXT816(0x28),0);
  }
  reverseOrientation_local = reverseOrientation;
  alloc_local = alloc;
  local_68 = renderFromObject;
  pp_Var49 = (_func_int **)operator_new__(uVar65);
  if (p.n != 0) {
    pp_Var50 = pp_Var49;
    do {
      *pp_Var50 = (_func_int *)0x0;
      *(undefined4 *)(pp_Var50 + 1) = 0;
      pp_Var50[2] = (_func_int *)0x0;
      pp_Var50[3] = (_func_int *)0x0;
      *(undefined2 *)(pp_Var50 + 4) = 0;
      pp_Var50 = pp_Var50 + 5;
    } while (pp_Var50 != pp_Var49 + p.n * 5);
    sVar64 = p.n;
    pp_Var50 = pp_Var49;
    do {
      resource.upstreamResource._0_4_ = ((p.ptr)->super_Tuple3<pbrt::Point3,_float>).z;
      p_Var40 = *(_func_int **)&(p.ptr)->super_Tuple3<pbrt::Point3,_float>;
      resource.blockSize._0_4_ = 0;
      resource.blockSize._4_4_ = 0;
      resource.currentBlock.ptr._0_4_ = 0;
      resource.currentBlock.ptr._4_4_ = 0;
      resource.currentBlock.size._0_2_ = 0;
      *(undefined2 *)(pp_Var50 + 4) = 0;
      *pp_Var50 = p_Var40;
      *(float *)(pp_Var50 + 1) = resource.upstreamResource._0_4_;
      *(ulong *)((long)pp_Var50 + 0xc) = (ulong)resource.upstreamResource._4_4_;
      *(undefined8 *)((long)pp_Var50 + 0x14) = 0;
      *(undefined4 *)((long)pp_Var50 + 0x1c) = 0;
      resource.super_memory_resource._vptr_memory_resource = pp_Var50;
      std::vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>>::emplace_back<pbrt::SDVertex*>
                ((vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>> *)&vertices,
                 (SDVertex **)&resource);
      pp_Var50 = pp_Var50 + 5;
      p.ptr = p.ptr + 1;
      sVar64 = sVar64 - 1;
    } while (sVar64 != 0);
  }
  uVar73 = uVar71 / 3;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar73;
  uVar65 = 0xffffffffffffffff;
  if (SUB168(auVar78 * ZEXT816(0x50),8) == 0) {
    uVar65 = SUB168(auVar78 * ZEXT816(0x50),0);
  }
  pp_Var50 = (_func_int **)operator_new__(uVar65);
  if (2 < uVar71) {
    memset(pp_Var50,0,((uVar73 * 0x50 - 0x50) / 0x50) * 0x50 + 0x50);
    uVar65 = uVar73;
    pp_Var75 = pp_Var50;
    do {
      resource.super_memory_resource._vptr_memory_resource = pp_Var75;
      std::vector<pbrt::SDFace*,std::allocator<pbrt::SDFace*>>::emplace_back<pbrt::SDFace*>
                ((vector<pbrt::SDFace*,std::allocator<pbrt::SDFace*>> *)&faces,(SDFace **)&resource)
      ;
      pp_Var75 = pp_Var75 + 10;
      uVar65 = uVar65 - 1;
    } while (uVar65 != 0);
  }
  if (2 < uVar71) {
    uVar65 = 0;
    do {
      pSVar70 = faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar65];
      lVar63 = 0;
      do {
        pSVar56 = vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[piVar62[lVar63]];
        pSVar70->v[lVar63] = pSVar56;
        pSVar56->startFace = pSVar70;
        lVar63 = lVar63 + 1;
      } while (lVar63 != 3);
      uVar65 = uVar65 + 1;
      piVar62 = piVar62 + 3;
    } while (uVar65 != uVar73);
  }
  edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &edges._M_t._M_impl.super__Rb_tree_header._M_header;
  edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (2 < uVar71) {
    uVar65 = 0;
    do {
      pSVar70 = faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar65];
      lVar63 = 0;
      do {
        lVar57 = lVar63 + 1;
        pSVar56 = pSVar70->v[lVar63];
        lVar72 = 0;
        if (lVar63 != 2) {
          lVar72 = lVar57;
        }
        pSVar53 = pSVar70->v[lVar72];
        resource.super_memory_resource._vptr_memory_resource = (_func_int **)pSVar56;
        if (pSVar53 < pSVar56) {
          resource.super_memory_resource._vptr_memory_resource = (_func_int **)pSVar53;
        }
        if (pSVar56 < pSVar53) {
          pSVar56 = pSVar53;
        }
        resource.upstreamResource._0_4_ = SUB84(pSVar56,0);
        resource.upstreamResource._4_4_ = (uint)((ulong)pSVar56 >> 0x20);
        resource.blockSize._0_4_ = 0;
        resource.blockSize._4_4_ = 0;
        resource.currentBlock.ptr._0_4_ = 0;
        resource.currentBlock.ptr._4_4_ = 0;
        resource.currentBlock.size._0_2_ = 0xffff;
        resource.currentBlock.size._2_2_ = 0xffff;
        iVar51 = std::
                 _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                 ::find((_Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                         *)&edges,(key_type *)&resource);
        auVar79 = in_ZMM1._0_16_;
        if ((_Rb_tree_header *)iVar51._M_node == &edges._M_t._M_impl.super__Rb_tree_header) {
          resource.blockSize._0_4_ = SUB84(pSVar70,0);
          resource.blockSize._4_4_ = (undefined4)((ulong)pSVar70 >> 0x20);
          resource.currentBlock.size._0_2_ = (undefined2)lVar63;
          resource.currentBlock.size._2_2_ = (undefined2)((ulong)lVar63 >> 0x10);
          std::
          _Rb_tree<pbrt::SDEdge,pbrt::SDEdge,std::_Identity<pbrt::SDEdge>,std::less<pbrt::SDEdge>,std::allocator<pbrt::SDEdge>>
          ::_M_insert_unique<pbrt::SDEdge_const&>
                    ((_Rb_tree<pbrt::SDEdge,pbrt::SDEdge,std::_Identity<pbrt::SDEdge>,std::less<pbrt::SDEdge>,std::allocator<pbrt::SDEdge>>
                      *)&edges,(SDEdge *)&resource);
        }
        else {
          iVar51 = std::
                   _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                   ::find((_Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                           *)&edges,(key_type *)&resource);
          resource.super_memory_resource._vptr_memory_resource =
               *(_func_int ***)(iVar51._M_node + 1);
          pSVar59 = (SDFace *)iVar51._M_node[1]._M_left;
          resource.upstreamResource._0_4_ = SUB84(iVar51._M_node[1]._M_parent,0);
          resource.upstreamResource._4_4_ = (uint)((ulong)iVar51._M_node[1]._M_parent >> 0x20);
          resource.blockSize._0_4_ = SUB84(pSVar59,0);
          resource.blockSize._4_4_ = (undefined4)((ulong)pSVar59 >> 0x20);
          resource.currentBlock.ptr._0_4_ = SUB84(iVar51._M_node[1]._M_right,0);
          resource.currentBlock.ptr._4_4_ = (undefined4)((ulong)iVar51._M_node[1]._M_right >> 0x20);
          _Var39 = iVar51._M_node[2]._M_color;
          resource.currentBlock.size._0_2_ = (undefined2)_Var39;
          resource.currentBlock.size._2_2_ = (undefined2)(_Var39 >> 0x10);
          pSVar59->f[(int)_Var39] = pSVar70;
          pSVar70->f[lVar63] = pSVar59;
          in_ZMM1 = ZEXT1664(auVar79);
          pVar111 = std::
                    _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                    ::equal_range((_Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                                   *)&edges,(key_type *)&resource);
          std::
          _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
          ::_M_erase_aux((_Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                          *)&edges,(_Base_ptr)pVar111.first._M_node,
                         (_Base_ptr)pVar111.second._M_node);
        }
        lVar63 = lVar57;
      } while (lVar57 != 3);
      uVar65 = uVar65 + 1;
    } while (uVar65 != uVar73);
  }
  if (p.n != 0) {
    sVar64 = 0;
    do {
      pSVar56 = vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                _M_impl.super__Vector_impl_data._M_start[sVar64];
      pSVar70 = pSVar56->startFace;
      do {
        iVar46 = SDFace::vnum(pSVar70,pSVar56);
        pSVar70 = pSVar70->f[iVar46];
        if (pSVar70 == (SDFace *)0x0) break;
      } while (pSVar70 != pSVar56->startFace);
      pSVar56->boundary = pSVar70 == (SDFace *)0x0;
      if (pSVar70 == (SDFace *)0x0) {
LAB_002b6f5c:
        if (pSVar56->boundary == true) {
          pSVar70 = pSVar56->startFace;
          iVar46 = 0;
          do {
            iVar47 = iVar46;
            iVar46 = SDFace::vnum(pSVar70,pSVar56);
            pSVar70 = pSVar70->f[iVar46];
            iVar46 = iVar47 + 1;
          } while (pSVar70 != (SDFace *)0x0);
          pSVar70 = pSVar56->startFace;
          iVar47 = 3 - iVar47;
          do {
            iVar46 = SDFace::vnum(pSVar70,pSVar56);
            pSVar70 = pSVar70->f[(iVar46 + 2) % 3];
            iVar47 = iVar47 + -1;
          } while (pSVar70 != (SDFace *)0x0);
          if (iVar47 == 0) goto LAB_002b6fd1;
        }
        bVar76 = false;
      }
      else {
        pSVar70 = pSVar56->startFace;
        iVar46 = 6;
        do {
          iVar47 = SDFace::vnum(pSVar70,pSVar56);
          pSVar70 = pSVar70->f[iVar47];
          iVar46 = iVar46 + -1;
        } while (pSVar70 != pSVar56->startFace);
        if (iVar46 != 0) goto LAB_002b6f5c;
LAB_002b6fd1:
        bVar76 = true;
      }
      pSVar56->regular = bVar76;
      sVar64 = sVar64 + 1;
    } while (sVar64 != p.n);
  }
  std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::vector(&f,&faces);
  std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::vector(&v,&vertices);
  pmVar52 = pstd::pmr::get_default_resource();
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&resource.usedBlocks;
  resource.super_memory_resource._vptr_memory_resource =
       (_func_int **)&PTR__monotonic_buffer_resource_0300a540;
  resource.upstreamResource._0_4_ = SUB84(pmVar52,0);
  resource.upstreamResource._4_4_ = (uint)((ulong)pmVar52 >> 0x20);
  resource.blockSize._0_4_ = 0x40000;
  resource.blockSize._4_4_ = 0;
  resource.currentBlock.ptr._0_4_ = 0;
  resource.currentBlock.ptr._4_4_ = 0;
  resource.currentBlock.size._0_2_ = 0;
  resource.currentBlock.size._2_2_ = 0;
  resource.currentBlock.size._4_4_ = 0;
  resource.currentBlockPos = 0;
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node._M_size = 0;
  resource.availableBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&resource.availableBlocks;
  resource.availableBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node._M_size = 0;
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       resource.usedBlocks.
       super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  resource.availableBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       resource.availableBlocks.
       super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if (0 < nLevels) {
    iVar46 = 0;
    do {
      ppSVar66 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
      Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._0_16_ =
           pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
           _M_impl.super__Vector_impl_data._0_16_;
      for (ppSVar68 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppSVar43 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_finish, ppSVar68 != ppSVar66;
          ppSVar68 = ppSVar68 + 1) {
        pSVar56 = *ppSVar68;
        iVar47 = (*resource.super_memory_resource._vptr_memory_resource[2])(&resource,0x28,8);
        pSVar53 = (SDVertex *)CONCAT44(extraout_var,iVar47);
        (pSVar53->p).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
        (pSVar53->p).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
        (pSVar53->p).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
        pSVar53->startFace = (SDFace *)SUB168(ZEXT816(0) << 0x40,0);
        pSVar53->child = (SDVertex *)SUB168(ZEXT816(0) << 0x40,8);
        pSVar53->regular = false;
        pSVar53->boundary = false;
        pSVar56->child = pSVar53;
        pSVar53->regular = pSVar56->regular;
        pSVar53->boundary = pSVar56->boundary;
        if (pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>>::
          _M_realloc_insert<pbrt::SDVertex*const&>
                    ((vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>> *)&pRing,
                     (iterator)
                     pRing.
                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&pSVar56->child);
        }
        else {
          *(SDVertex **)
           &(pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float> = pSVar53
          ;
          pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)&((pRing.
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->
                         super_Tuple3<pbrt::Point3,_float>).z;
        }
      }
      ppSVar66 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppSVar68 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      for (ppSVar67 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
          super__Vector_impl_data._M_start = ppSVar66,
          v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppSVar68, ppSVar67 != ppSVar43;
          ppSVar67 = ppSVar67 + 1) {
        pSVar70 = *ppSVar67;
        lVar63 = 0;
        do {
          in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
          iVar47 = (*resource.super_memory_resource._vptr_memory_resource[2])(&resource,0x50,8);
          pauVar54 = (undefined1 (*) [64])CONCAT44(extraout_var_00,iVar47);
          *(undefined1 (*) [64])(*pauVar54 + 0x10) = ZEXT1664(ZEXT816(0) << 0x40);
          *pauVar54 = ZEXT1664(ZEXT816(0) << 0x40);
          *(undefined1 (**) [64])((long)pSVar70->children + lVar63) = pauVar54;
          if (Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            std::vector<pbrt::SDFace*,std::allocator<pbrt::SDFace*>>::
            _M_realloc_insert<pbrt::SDFace*const&>
                      ((vector<pbrt::SDFace*,std::allocator<pbrt::SDFace*>> *)&Ns,
                       (iterator)
                       Ns.
                       super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (SDFace **)((long)pSVar70->children + lVar63));
          }
          else {
            *(undefined1 (**) [64])
             &(Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Normal3,_float> =
                 pauVar54;
            Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)&((Ns.
                             super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->
                           super_Tuple3<pbrt::Normal3,_float>).z;
          }
          lVar63 = lVar63 + 8;
        } while (lVar63 != 0x20);
        ppSVar66 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        ppSVar68 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl
                   .super__Vector_impl_data._M_finish;
      }
      for (; ppSVar43 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish, ppSVar66 != ppSVar68;
          ppSVar66 = ppSVar66 + 1) {
        pSVar56 = *ppSVar66;
        if (pSVar56->boundary == false) {
          if (pSVar56->regular == true) {
            auVar95 = ZEXT856(0);
            auVar107 = ZEXT1260(in_ZMM1._4_12_);
            PVar112 = weightOneRing(pSVar56,0.0625);
            in_ZMM1._0_4_ = PVar112.super_Tuple3<pbrt::Point3,_float>.z;
            in_ZMM1._4_60_ = auVar107;
            auVar90._0_8_ = PVar112.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar90._8_56_ = auVar95;
            auVar79 = auVar90._0_16_;
          }
          else {
            pSVar70 = pSVar56->startFace;
            iVar47 = 0;
            do {
              iVar48 = SDFace::vnum(pSVar70,pSVar56);
              pSVar70 = pSVar70->f[iVar48];
              iVar47 = iVar47 + 1;
            } while (pSVar70 != pSVar56->startFace);
            auVar107 = (undefined1  [60])0x0;
            auVar95 = (undefined1  [56])0x0;
            PVar112 = weightOneRing(pSVar56,(Float)((uint)(iVar47 == 3) * 0x3e400000 +
                                                   (uint)(iVar47 != 3) *
                                                   (int)(3.0 / ((float)iVar47 * 8.0))));
            in_ZMM1._0_4_ = PVar112.super_Tuple3<pbrt::Point3,_float>.z;
            in_ZMM1._4_60_ = auVar107;
            auVar93._0_8_ = PVar112.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar93._8_56_ = auVar95;
            auVar79 = auVar93._0_16_;
          }
        }
        else {
          auVar95 = ZEXT856(0);
          auVar107 = ZEXT1260(in_ZMM1._4_12_);
          PVar112 = weightBoundary(pSVar56,0.125);
          in_ZMM1._0_4_ = PVar112.super_Tuple3<pbrt::Point3,_float>.z;
          in_ZMM1._4_60_ = auVar107;
          auVar89._0_8_ = PVar112.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar89._8_56_ = auVar95;
          auVar79 = auVar89._0_16_;
        }
        pSVar56 = pSVar56->child;
        uVar20 = vmovlps_avx(auVar79);
        (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar20;
        (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar20 >> 0x20);
        (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.z = in_ZMM1._0_4_;
      }
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ppSVar66 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppSVar68 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      for (ppSVar67 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
          super__Vector_impl_data._M_start = ppSVar66,
          v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppSVar68, ppSVar67 != ppSVar43;
          ppSVar67 = ppSVar67 + 1) {
        pSVar70 = *ppSVar67;
        lVar63 = 3;
        do {
          pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = &pSVar70->v[lVar63 + -3]->p;
          lVar57 = 0;
          if (lVar63 != 5) {
            lVar57 = lVar63 + -2;
          }
          pSVar56 = pSVar70->v[lVar57];
          pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar56 < pLimit.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start = &pSVar56->p;
          }
          if (pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish < pSVar56) {
            pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = &pSVar56->p;
          }
          register0x00001200 = (SDFace * [2])(ZEXT816(0) << 0x40);
          in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
          ppSVar55 = std::
                     map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                     ::operator[](&edgeVerts,(key_type *)&pLimit);
          vert = *ppSVar55;
          if (vert == (mapped_type)0x0) {
            iVar47 = (*resource.super_memory_resource._vptr_memory_resource[2])(&resource,0x28,8);
            vert = (SDVertex *)CONCAT44(extraout_var_01,iVar47);
            (vert->p).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
            (vert->p).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
            (vert->p).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
            vert->startFace = (SDFace *)0x0;
            vert->child = (SDVertex *)0x0;
            vert->regular = false;
            vert->boundary = false;
            if (pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>>::
              _M_realloc_insert<pbrt::SDVertex*const&>
                        ((vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>> *)&pRing,
                         (iterator)
                         pRing.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&vert);
            }
            else {
              *(SDVertex **)
               &(pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float> =
                   vert;
              pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)&((pRing.
                               super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->
                             super_Tuple3<pbrt::Point3,_float>).z;
            }
            vert->regular = true;
            bVar76 = pSVar70->v[lVar63] == (SDVertex *)0x0;
            vert->boundary = bVar76;
            vert->startFace = pSVar70->children[3];
            uVar2 = ((pLimit.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Point3,_float>)
                    .x;
            uVar21 = ((pLimit.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Point3,_float>
                     ).y;
            fVar81 = ((pLimit.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Point3,_float>
                     ).z;
            if (bVar76) {
              auVar99._0_4_ = (float)uVar2 * 0.5;
              auVar99._4_4_ = (float)uVar21 * 0.5;
              auVar99._8_8_ = 0;
              uVar20 = vmovlps_avx(auVar99);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar20;
              (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar20 >> 0x20);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.z = fVar81 * 0.5;
              uVar8 = ((pLimit.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->
                      super_Tuple3<pbrt::Point3,_float>).x;
              uVar27 = ((pLimit.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super_Tuple3<pbrt::Point3,_float>).y;
              auVar77._0_4_ = (float)uVar8 * 0.5;
              auVar77._4_4_ = (float)uVar27 * 0.5;
              auVar77._8_8_ = 0;
              fVar81 = ((pLimit.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super_Tuple3<pbrt::Point3,_float>).z * 0.5;
            }
            else {
              auVar96._0_4_ = (float)uVar2 * 0.375;
              auVar96._4_4_ = (float)uVar21 * 0.375;
              auVar96._8_8_ = 0;
              uVar20 = vmovlps_avx(auVar96);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar20;
              (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar20 >> 0x20);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.z = fVar81 * 0.375;
              fVar81 = ((pLimit.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super_Tuple3<pbrt::Point3,_float>).z;
              uVar3 = ((pLimit.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->
                      super_Tuple3<pbrt::Point3,_float>).x;
              uVar22 = ((pLimit.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super_Tuple3<pbrt::Point3,_float>).y;
              uVar4 = (vert->p).super_Tuple3<pbrt::Point3,_float>.x;
              uVar23 = (vert->p).super_Tuple3<pbrt::Point3,_float>.y;
              auVar97._0_4_ = (float)uVar3 * 0.375 + (float)uVar4;
              auVar97._4_4_ = (float)uVar22 * 0.375 + (float)uVar23;
              auVar97._8_8_ = 0;
              uVar20 = vmovlps_avx(auVar97);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar20;
              (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar20 >> 0x20);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.z =
                   fVar81 * 0.375 + (vert->p).super_Tuple3<pbrt::Point3,_float>.z;
              pSVar56 = SDFace::otherVert(pSVar70,(SDVertex *)
                                                  pLimit.
                                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                          (SDVertex *)
                                          pLimit.
                                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
              fVar81 = (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.z;
              uVar5 = (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.x;
              uVar24 = (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.y;
              uVar6 = (vert->p).super_Tuple3<pbrt::Point3,_float>.x;
              uVar25 = (vert->p).super_Tuple3<pbrt::Point3,_float>.y;
              auVar98._0_4_ = (float)uVar5 * 0.125 + (float)uVar6;
              auVar98._4_4_ = (float)uVar24 * 0.125 + (float)uVar25;
              auVar98._8_8_ = 0;
              uVar20 = vmovlps_avx(auVar98);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar20;
              (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar20 >> 0x20);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.z =
                   fVar81 * 0.125 + (vert->p).super_Tuple3<pbrt::Point3,_float>.z;
              pSVar56 = SDFace::otherVert((SDFace *)pSVar70->v[lVar63],
                                          (SDVertex *)
                                          pLimit.
                                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (SDVertex *)
                                          pLimit.
                                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
              uVar7 = (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.x;
              uVar26 = (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.y;
              auVar83._4_4_ = uVar26;
              auVar83._0_4_ = uVar7;
              auVar83._8_8_ = 0;
              auVar42._8_4_ = 0x3e000000;
              auVar42._0_8_ = 0x3e0000003e000000;
              auVar42._12_4_ = 0x3e000000;
              auVar77 = vmulps_avx512vl(auVar83,auVar42);
              fVar81 = (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.z * 0.125;
            }
            pSVar56 = vert;
            uVar9 = (vert->p).super_Tuple3<pbrt::Point3,_float>.x;
            uVar28 = (vert->p).super_Tuple3<pbrt::Point3,_float>.y;
            auVar100._0_4_ = auVar77._0_4_ + (float)uVar9;
            auVar100._4_4_ = auVar77._4_4_ + (float)uVar28;
            auVar100._8_4_ = auVar77._8_4_ + 0.0;
            auVar100._12_4_ = auVar77._12_4_ + 0.0;
            in_ZMM1 = ZEXT1664(auVar100);
            uVar20 = vmovlps_avx(auVar100);
            (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar20;
            (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar20 >> 0x20);
            (vert->p).super_Tuple3<pbrt::Point3,_float>.z =
                 fVar81 + (vert->p).super_Tuple3<pbrt::Point3,_float>.z;
            ppSVar55 = std::
                       map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                       ::operator[](&edgeVerts,(key_type *)&pLimit);
            *ppSVar55 = pSVar56;
          }
          lVar63 = lVar63 + 1;
        } while (lVar63 != 6);
        ppSVar66 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        ppSVar68 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl
                   .super__Vector_impl_data._M_finish;
      }
      for (; ppSVar45 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
          ppSVar43 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
          ppSVar67 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
          ppSVar44 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_finish, ppSVar66 != ppSVar68;
          ppSVar66 = ppSVar66 + 1) {
        pSVar56 = *ppSVar66;
        in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
        iVar47 = SDFace::vnum(pSVar56->startFace,pSVar56);
        pSVar56->child->startFace = pSVar56->startFace->children[iVar47];
      }
      for (; f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
             super__Vector_impl_data._M_start = ppSVar67,
          f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppSVar44, ppSVar43 != ppSVar45;
          ppSVar43 = ppSVar43 + 1) {
        pSVar70 = *ppSVar43;
        uVar65 = 2;
        lVar63 = 1;
        do {
          lVar57 = lVar63;
          if (lVar63 == 3) {
            lVar57 = 0;
          }
          pSVar70->children[3]->v[lVar63 + 2] = (SDVertex *)pSVar70->children[lVar57];
          pSVar70->f[lVar63 + 2]->f[lVar57] = pSVar70->children[3];
          pSVar59 = (SDFace *)pSVar70->v[lVar63 + 2];
          pSVar58 = (SDFace *)0x0;
          if (pSVar59 != (SDFace *)0x0) {
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            iVar47 = SDFace::vnum(pSVar59,pSVar70->v[lVar63 + -1]);
            pSVar58 = pSVar59->children[iVar47];
          }
          pSVar70->f[lVar63 + 2]->v[lVar63 + 2] = (SDVertex *)pSVar58;
          pSVar59 = *(SDFace **)((long)pSVar70 + lVar63 * 8 + (uVar65 / 3) * -0x18 + 0x20);
          if (pSVar59 == (SDFace *)0x0) {
            pSVar59 = (SDFace *)0x0;
          }
          else {
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            iVar47 = SDFace::vnum(pSVar59,pSVar70->v[lVar63 + -1]);
            pSVar59 = pSVar59->children[iVar47];
          }
          *(SDFace **)((long)pSVar70->f[lVar63 + 2] + lVar63 * 8 + (uVar65 / 3) * -0x18 + 0x20) =
               pSVar59;
          uVar65 = uVar65 + 1;
          lVar63 = lVar63 + 1;
        } while (lVar63 != 4);
        ppSVar67 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppSVar44 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      for (; ppSVar67 != ppSVar44; ppSVar67 = ppSVar67 + 1) {
        pSVar70 = *ppSVar67;
        lVar63 = 1;
        do {
          pSVar70->f[lVar63 + 2]->v[lVar63 + -1] = pSVar70->v[lVar63 + -1]->child;
          pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = &pSVar70->v[lVar63 + -1]->p;
          lVar57 = 0;
          if (lVar63 != 3) {
            lVar57 = lVar63;
          }
          pSVar56 = pSVar70->v[lVar57];
          pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar56 < pLimit.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start = &pSVar56->p;
          }
          if (pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish < pSVar56) {
            pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = &pSVar56->p;
          }
          register0x00001200 = (SDFace * [2])(ZEXT816(0) << 0x40);
          in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
          ppSVar55 = std::
                     map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                     ::operator[](&edgeVerts,(key_type *)&pLimit);
          pSVar41 = *ppSVar55;
          pSVar70->f[lVar63 + 2]->v[lVar57] = pSVar41;
          pSVar70->children[lVar57]->v[lVar63 + -1] = pSVar41;
          pSVar70->children[3]->v[lVar63 + -1] = pSVar41;
          lVar63 = lVar63 + 1;
        } while (lVar63 != 4);
      }
      in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
      std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::operator=
                (&f,(vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)&Ns);
      std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::operator=
                (&v,(vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)&pRing);
      std::
      _Rb_tree<pbrt::SDEdge,_std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>,_std::_Select1st<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
      ::~_Rb_tree(&edgeVerts._M_t);
      if (pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(pRing.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)pRing.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)pRing.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(Ns.
                        super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)Ns.
                              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)Ns.
                              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar46 = iVar46 + 1;
    } while (iVar46 != nLevels);
  }
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            (&pLimit,(long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&edgeVerts);
  if (v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar65 = 0;
    do {
      auVar107 = in_ZMM1._4_60_;
      pSVar56 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar65];
      if (pSVar56->boundary == true) {
        auVar95 = (undefined1  [56])0x0;
        PVar112 = weightBoundary(pSVar56,0.2);
        in_ZMM1._0_4_ = PVar112.super_Tuple3<pbrt::Point3,_float>.z;
        in_ZMM1._4_60_ = auVar107;
        auVar91._0_8_ = PVar112.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar91._8_56_ = auVar95;
        auVar79 = auVar91._0_16_;
      }
      else {
        pSVar70 = pSVar56->startFace;
        iVar46 = 0;
        do {
          iVar47 = SDFace::vnum(pSVar70,pSVar56);
          pSVar70 = pSVar70->f[iVar47];
          iVar46 = iVar46 + 1;
        } while (pSVar70 != pSVar56->startFace);
        auVar107 = (undefined1  [60])0x0;
        auVar95 = ZEXT856(0);
        PVar112 = weightOneRing(pSVar56,1.0 / ((float)((uint)(iVar46 == 3) * 0x40000000 +
                                                      (uint)(iVar46 != 3) *
                                                      (int)(3.0 / ((3.0 / ((float)iVar46 * 8.0)) *
                                                                  8.0))) + (float)iVar46));
        in_ZMM1._0_4_ = PVar112.super_Tuple3<pbrt::Point3,_float>.z;
        in_ZMM1._4_60_ = auVar107;
        auVar92._0_8_ = PVar112.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar92._8_56_ = auVar95;
        auVar79 = auVar92._0_16_;
      }
      uVar20 = vmovlps_avx(auVar79);
      pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar65].super_Tuple3<pbrt::Point3,_float>.x =
           (float)(int)uVar20;
      pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar65].super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar20 >> 0x20);
      pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar65].super_Tuple3<pbrt::Point3,_float>.z = in_ZMM1._0_4_;
      uVar65 = uVar65 + 1;
    } while (uVar65 < (ulong)((long)v.
                                    super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)v.
                                    super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
  }
  else {
    lVar63 = 0;
    uVar65 = 0;
    do {
      pSVar56 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar65];
      (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.z =
           *(float *)((long)&((pLimit.
                               super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_Tuple3<pbrt::Point3,_float>).z + lVar63);
      uVar20 = *(undefined8 *)
                ((long)&((pLimit.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_Tuple3<pbrt::Point3,_float>).x + lVar63);
      (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar20;
      (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar20 >> 0x20);
      uVar65 = uVar65 + 1;
      __n = (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
      lVar63 = lVar63 + 0xc;
    } while (uVar65 < __n);
  }
  Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0);
  Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::reserve(&Ns,__n);
  pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0);
  pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0xc0);
  ppSVar66 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
       super__Vector_impl_data._M_start + 0x10;
  auVar93 = ZEXT1664(ZEXT816(0) << 0x40);
  *(undefined1 (*) [64])
   &pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
    super__Vector_impl_data._M_start[10].super_Tuple3<pbrt::Point3,_float>.z = auVar93;
  *(undefined1 (*) [64])
   &pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
    super__Vector_impl_data._M_start[5].super_Tuple3<pbrt::Point3,_float>.y = auVar93;
  *(undefined1 (*) [64])
   pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
   super__Vector_impl_data._M_start = auVar93;
  pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  ppSVar68 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    ppSVar43 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppSVar68 == ppSVar66) {
      lVar63 = (long)f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&vert,lVar63 * 3,(allocator_type *)&edgeVerts)
      ;
      pSVar56 = vert;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar57 = (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar72 = 0;
        lVar74 = 0;
        do {
          pmVar60 = std::
                    map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                    ::operator[]((map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                                  *)&edgeVerts,
                                 (key_type *)
                                 ((long)v.
                                        super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar72));
          *pmVar60 = (mapped_type)lVar74;
          lVar74 = lVar74 + 1;
          lVar72 = lVar72 + 8;
        } while (lVar57 + (ulong)(lVar57 == 0) != lVar74);
      }
      if (f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppSVar43) {
        lVar57 = 0;
        do {
          lVar72 = 0;
          do {
            pfVar61 = (float *)std::
                               map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                               ::operator[]((map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                                             *)&edgeVerts,
                                            (key_type *)
                                            ((long)f.
                                                  super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar57]
                                                  ->v + lVar72));
            (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.x = *pfVar61;
            pSVar56 = (SDVertex *)&(pSVar56->p).super_Tuple3<pbrt::Point3,_float>.y;
            lVar72 = lVar72 + 8;
          } while (lVar72 != 0x18);
          lVar57 = lVar57 + 1;
        } while (lVar57 != lVar63 + (ulong)(lVar63 == 0));
      }
      local_88.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      iVar46 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                         (alloc_local.memoryResource,0x40,8);
      pstd::pmr::polymorphic_allocator<std::byte>::
      construct<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>>
                (&alloc_local,(TriangleMesh *)CONCAT44(extraout_var_02,iVar46),local_68,
                 &reverseOrientation_local,(vector<int,_std::allocator<int>_> *)&vert,&pLimit,
                 &local_88,&Ns,&local_a8,&local_d8);
      if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a8.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.
                        super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<pbrt::SDVertex_*,_std::pair<pbrt::SDVertex_*const,_int>,_std::_Select1st<std::pair<pbrt::SDVertex_*const,_int>_>,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
      ::~_Rb_tree((_Rb_tree<pbrt::SDVertex_*,_std::pair<pbrt::SDVertex_*const,_int>,_std::_Select1st<std::pair<pbrt::SDVertex_*const,_int>_>,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                   *)&edgeVerts);
      if (vert != (SDVertex *)0x0) {
        operator_delete(vert,(long)local_1f8 - (long)vert);
      }
      if (pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(pRing.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)pRing.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)pRing.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(Ns.
                        super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)Ns.
                              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)Ns.
                              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(pLimit.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)pLimit.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)pLimit.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pstd::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(&resource);
      if (v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)v.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)v.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
      ::~_Rb_tree(&edges._M_t);
      operator_delete__(pp_Var50);
      operator_delete__(pp_Var49);
      if (faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)faces.
                              super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)faces.
                              super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vertices.
                        super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)vertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return (TriangleMesh *)CONCAT44(extraout_var_02,iVar46);
    }
    pSVar56 = *ppSVar68;
    pSVar70 = pSVar56->startFace;
    if (pSVar56->boundary == false) {
      uVar65 = 0;
      do {
        iVar46 = SDFace::vnum(pSVar70,pSVar56);
        pSVar70 = pSVar70->f[iVar46];
        uVar65 = (ulong)((int)uVar65 + 1);
      } while (pSVar70 != pSVar56->startFace);
    }
    else {
      uVar65 = 0;
      do {
        iVar46 = SDFace::vnum(pSVar70,pSVar56);
        pSVar70 = pSVar70->f[iVar46];
        uVar65 = (ulong)((int)uVar65 + 1);
      } while (pSVar70 != (SDFace *)0x0);
      pSVar70 = pSVar56->startFace;
      do {
        iVar46 = SDFace::vnum(pSVar70,pSVar56);
        pSVar70 = pSVar70->f[(iVar46 + 2) % 3];
        uVar65 = (ulong)((int)uVar65 + 1);
      } while (pSVar70 != (SDFace *)0x0);
    }
    iVar46 = (int)uVar65;
    if ((int)((ulong)((long)pRing.
                            super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)pRing.
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 < iVar46)
    {
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::resize
                (&pRing,(long)iVar46);
    }
    SDVertex::oneRing(pSVar56,pRing.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    if (pSVar56->boundary == false) {
      _local_268 = ZEXT812(0);
      fStack_25c = 0.0;
      local_228 = ZEXT416(0);
      lVar63 = 8;
      uVar71 = 0;
      auVar93 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar110 = ZEXT816(0) << 0x40;
      do {
        fVar81 = ((float)(int)uVar71 * 6.2831855) / (float)iVar46;
        local_b8._0_4_ = fVar81;
        fVar81 = cosf(fVar81);
        local_228 = ZEXT416((uint)((float)local_228._0_4_ +
                                  fVar81 * *(float *)((long)&((pRing.
                                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_Tuple3<pbrt::Point3,_float>).x + lVar63)));
        uVar20 = *(undefined8 *)
                  ((long)pRing.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar63 + -8);
        local_268._4_4_ = (float)local_268._4_4_ + fVar81 * (float)((ulong)uVar20 >> 0x20);
        local_268._0_4_ = (float)local_268._0_4_ + fVar81 * (float)uVar20;
        fStack_260 = fStack_260 + fVar81 * 0.0;
        fStack_25c = fStack_25c + fVar81 * 0.0;
        fVar81 = sinf((float)local_b8._0_4_);
        local_198 = auVar110._0_4_;
        fStack_194 = auVar110._4_4_;
        fStack_190 = auVar110._8_4_;
        fStack_18c = auVar110._12_4_;
        local_188 = auVar93._0_4_;
        local_188 = local_188 +
                    fVar81 * *(float *)((long)&((pRing.
                                                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super_Tuple3<pbrt::Point3,_float>).x + lVar63);
        auVar93 = ZEXT464((uint)local_188);
        auVar109 = ZEXT416((uint)local_188);
        uVar20 = *(undefined8 *)
                  ((long)pRing.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar63 + -8);
        auVar110._0_4_ = local_198 + fVar81 * (float)uVar20;
        auVar110._4_4_ = fStack_194 + fVar81 * (float)((ulong)uVar20 >> 0x20);
        auVar110._8_4_ = fStack_190 + fVar81 * 0.0;
        auVar110._12_4_ = fStack_18c + fVar81 * 0.0;
        uVar71 = uVar71 + 1;
        lVar63 = lVar63 + 0xc;
      } while (uVar65 != uVar71);
    }
    else {
      uVar69 = iVar46 - 1;
      uVar65._0_4_ = ((pRing.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Point3,_float>
                     ).x;
      uVar65._4_4_ = ((pRing.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Point3,_float>
                     ).y;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar65;
      uVar10 = pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[(int)uVar69].
               super_Tuple3<pbrt::Point3,_float>.x;
      uVar29 = pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[(int)uVar69].
               super_Tuple3<pbrt::Point3,_float>.y;
      auVar101._4_4_ = uVar29;
      auVar101._0_4_ = uVar10;
      auVar101._8_8_ = 0;
      _local_268 = vsubps_avx(auVar101,auVar84);
      fVar81 = ((pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Point3,_float>).z;
      local_228 = ZEXT416((uint)(pRing.
                                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[(int)uVar69].
                                 super_Tuple3<pbrt::Point3,_float>.z - fVar81));
      if (iVar46 == 4) {
        fVar80 = pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[1].super_Tuple3<pbrt::Point3,_float>.z;
        fVar82 = pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[2].super_Tuple3<pbrt::Point3,_float>.z;
        fVar1 = (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.z;
        fVar81 = ((((fVar80 + fVar80) - fVar81) + fVar82 + fVar82) -
                 pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[3].super_Tuple3<pbrt::Point3,_float>.z) -
                 (fVar1 + fVar1);
        uVar14 = pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[1].super_Tuple3<pbrt::Point3,_float>.x;
        uVar33 = pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[1].super_Tuple3<pbrt::Point3,_float>.y;
        auVar103._0_4_ = (float)uVar14 + (float)uVar14;
        auVar103._4_4_ = (float)uVar33 + (float)uVar33;
        auVar103._8_8_ = 0;
        auVar79 = vsubps_avx(auVar103,auVar84);
        uVar15 = pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[2].super_Tuple3<pbrt::Point3,_float>.x;
        uVar34 = pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[2].super_Tuple3<pbrt::Point3,_float>.y;
        auVar87._0_4_ = auVar79._0_4_ + (float)uVar15 + (float)uVar15;
        auVar87._4_4_ = auVar79._4_4_ + (float)uVar34 + (float)uVar34;
        auVar87._8_4_ = auVar79._8_4_ + 0.0;
        auVar87._12_4_ = auVar79._12_4_ + 0.0;
        uVar16 = pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[3].super_Tuple3<pbrt::Point3,_float>.x;
        uVar35 = pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[3].super_Tuple3<pbrt::Point3,_float>.y;
        auVar104._4_4_ = uVar35;
        auVar104._0_4_ = uVar16;
        auVar104._8_8_ = 0;
        auVar85 = vsubps_avx(auVar87,auVar104);
LAB_002b7c54:
        auVar109 = ZEXT416((uint)fVar81);
        uVar17 = (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.x;
        uVar36 = (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.y;
        auVar105._0_4_ = (float)uVar17 + (float)uVar17;
        auVar105._4_4_ = (float)uVar36 + (float)uVar36;
        auVar105._8_8_ = 0;
        auVar110 = vsubps_avx(auVar85,auVar105);
      }
      else if (iVar46 == 3) {
        uVar12 = pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[1].super_Tuple3<pbrt::Point3,_float>.x;
        uVar31 = pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[1].super_Tuple3<pbrt::Point3,_float>.y;
        auVar86._4_4_ = uVar31;
        auVar86._0_4_ = uVar12;
        auVar86._8_8_ = 0;
        uVar13 = (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.x;
        uVar32 = (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.y;
        auVar102._4_4_ = uVar32;
        auVar102._0_4_ = uVar13;
        auVar102._8_8_ = 0;
        auVar110 = vsubps_avx(auVar86,auVar102);
        auVar109 = ZEXT416((uint)(pRing.
                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                  super_Tuple3<pbrt::Point3,_float>.z -
                                 (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.z));
      }
      else {
        if (iVar46 == 2) {
          fVar80 = (pSVar56->p).super_Tuple3<pbrt::Point3,_float>.z;
          fVar81 = (fVar81 + pRing.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].
                             super_Tuple3<pbrt::Point3,_float>.z) - (fVar80 + fVar80);
          uVar11 = pRing.
                   super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[1].super_Tuple3<pbrt::Point3,_float>.x;
          uVar30 = pRing.
                   super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[1].super_Tuple3<pbrt::Point3,_float>.y;
          auVar85._0_4_ = (float)(undefined4)uVar65 + (float)uVar11;
          auVar85._4_4_ = (float)uVar65._4_4_ + (float)uVar30;
          auVar85._8_8_ = 0;
          goto LAB_002b7c54;
        }
        fVar80 = 3.1415927 / (float)(int)uVar69;
        fVar81 = sinf(fVar80);
        uVar18 = ((pRing.
                   super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Point3,_float>).x;
        uVar37 = ((pRing.
                   super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Point3,_float>).y;
        uVar19 = pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[(int)uVar69].
                 super_Tuple3<pbrt::Point3,_float>.x;
        uVar38 = pRing.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[(int)uVar69].
                 super_Tuple3<pbrt::Point3,_float>.y;
        auVar108._0_4_ = fVar81 * ((float)uVar18 + (float)uVar19);
        auVar108._4_4_ = fVar81 * ((float)uVar37 + (float)uVar38);
        auVar108._8_4_ = fVar81 * 0.0;
        auVar108._12_4_ = fVar81 * 0.0;
        fVar81 = fVar81 * (((pRing.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_Tuple3<pbrt::Point3,_float>).z +
                          pRing.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar69].
                          super_Tuple3<pbrt::Point3,_float>.z);
        if (2 < iVar46) {
          uVar65 = 1;
          lVar63 = 0x14;
          do {
            _local_b8 = auVar108;
            auVar94._0_4_ = cosf(fVar80);
            auVar94._4_60_ = extraout_var_03;
            auVar79 = vfmadd132ss_fma(auVar94._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                      ZEXT416(0x40000000));
            fVar82 = sinf((float)(int)uVar65 * fVar80);
            fVar82 = fVar82 * auVar79._0_4_;
            fVar81 = fVar81 + fVar82 * *(float *)((long)&((pRing.
                                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_Tuple3<pbrt::Point3,_float>).x + lVar63);
            uVar20 = *(undefined8 *)
                      ((long)pRing.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar63 + -8);
            auVar108._0_4_ = (float)local_b8._0_4_ + fVar82 * (float)uVar20;
            auVar108._4_4_ = (float)local_b8._4_4_ + fVar82 * (float)((ulong)uVar20 >> 0x20);
            auVar108._8_4_ = fStack_b0 + fVar82 * 0.0;
            auVar108._12_4_ = fStack_ac + fVar82 * 0.0;
            uVar65 = uVar65 + 1;
            lVar63 = lVar63 + 0xc;
          } while (uVar69 != uVar65);
        }
        auVar110._0_8_ = auVar108._0_8_ ^ 0x8000000080000000;
        auVar110._8_4_ = (float)(auVar108._8_4_ ^ 0x80000000);
        auVar110._12_4_ = (float)(auVar108._12_4_ ^ 0x80000000);
        auVar109._0_4_ = -fVar81;
        auVar109._4_4_ = 0x80000000;
        auVar109._8_4_ = 0x80000000;
        auVar109._12_4_ = 0x80000000;
      }
    }
    auVar79 = vmovshdup_avx(auVar110);
    auVar78 = vmovshdup_avx(_local_268);
    auVar77 = ZEXT416((uint)(auVar79._0_4_ * local_228._0_4_));
    auVar78 = vfmsub213ss_fma(auVar78,auVar109,auVar77);
    auVar79 = vfnmadd213ss_fma(auVar79,local_228,auVar77);
    edgeVerts._M_t._M_impl._0_4_ = auVar78._0_4_ + auVar79._0_4_;
    auVar78 = vpermt2ps_avx512vl(auVar110,SUB6416(ZEXT464(4),0),auVar109);
    auVar106._0_4_ = auVar78._0_4_ * local_268._0_4_;
    auVar106._4_4_ = auVar78._4_4_ * local_268._4_4_;
    auVar106._8_4_ = auVar78._8_4_ * local_268._8_4_;
    auVar106._12_4_ = auVar78._12_4_ * local_268._12_4_;
    auVar79 = vpermt2ps_avx512vl(_local_268,SUB6416(ZEXT464(4),0),local_228);
    auVar79 = vfmsub213ps_fma(auVar79,auVar110,auVar106);
    auVar78 = vfnmadd213ps_fma(auVar78,_local_268,auVar106);
    auVar88._0_4_ = auVar79._0_4_ + auVar78._0_4_;
    auVar88._4_4_ = auVar79._4_4_ + auVar78._4_4_;
    auVar88._8_4_ = auVar79._8_4_ + auVar78._8_4_;
    auVar88._12_4_ = auVar79._12_4_ + auVar78._12_4_;
    uVar20 = vmovlps_avx(auVar88);
    edgeVerts._M_t._M_impl._4_4_ = SUB84(uVar20,0);
    edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (_Rb_tree_color)((ulong)uVar20 >> 0x20);
    if (Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>::
      _M_realloc_insert<pbrt::Normal3<float>>
                ((vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>> *)&Ns,
                 (iterator)
                 Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(Normal3<float> *)&edgeVerts);
    }
    else {
      ((Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Normal3,_float>).z =
           (float)edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      ((Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Normal3,_float>).x =
           (float)edgeVerts._M_t._M_impl._0_4_;
      ((Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Normal3,_float>).y =
           (float)edgeVerts._M_t._M_impl._4_4_;
      Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    ppSVar68 = ppSVar68 + 1;
  } while( true );
}

Assistant:

TriangleMesh *LoopSubdivide(const Transform *renderFromObject, bool reverseOrientation,
                            int nLevels, pstd::span<const int> vertexIndices,
                            pstd::span<const Point3f> p, Allocator alloc) {
    std::vector<SDVertex *> vertices;
    std::vector<SDFace *> faces;
    // Allocate _LoopSubdiv_ vertices and faces
    std::unique_ptr<SDVertex[]> verts = std::make_unique<SDVertex[]>(p.size());
    for (int i = 0; i < p.size(); ++i) {
        verts[i] = SDVertex(p[i]);
        vertices.push_back(&verts[i]);
    }
    size_t nFaces = vertexIndices.size() / 3;
    std::unique_ptr<SDFace[]> fs = std::make_unique<SDFace[]>(nFaces);
    for (int i = 0; i < nFaces; ++i)
        faces.push_back(&fs[i]);

    // Set face to vertex pointers
    const int *vp = vertexIndices.data();
    for (size_t i = 0; i < nFaces; ++i, vp += 3) {
        SDFace *f = faces[i];
        for (int j = 0; j < 3; ++j) {
            SDVertex *v = vertices[vp[j]];
            f->v[j] = v;
            v->startFace = f;
        }
    }

    // Set neighbor pointers in _faces_
    std::set<SDEdge> edges;
    for (int i = 0; i < nFaces; ++i) {
        SDFace *f = faces[i];
        for (int edgeNum = 0; edgeNum < 3; ++edgeNum) {
            // Update neighbor pointer for _edgeNum_
            int v0 = edgeNum, v1 = NEXT(edgeNum);
            SDEdge e(f->v[v0], f->v[v1]);
            if (edges.find(e) == edges.end()) {
                // Handle new edge
                e.f[0] = f;
                e.f0edgeNum = edgeNum;
                edges.insert(e);
            } else {
                // Handle previously seen edge
                e = *edges.find(e);
                e.f[0]->f[e.f0edgeNum] = f;
                f->f[edgeNum] = e.f[0];
                edges.erase(e);
            }
        }
    }

    // Finish vertex initialization
    for (size_t i = 0; i < p.size(); ++i) {
        SDVertex *v = vertices[i];
        SDFace *f = v->startFace;
        do {
            f = f->nextFace(v);
        } while ((f != nullptr) && f != v->startFace);
        v->boundary = (f == nullptr);
        if (!v->boundary && v->valence() == 6)
            v->regular = true;
        else if (v->boundary && v->valence() == 4)
            v->regular = true;
        else
            v->regular = false;
    }

    // Refine _LoopSubdiv_ into triangles
    std::vector<SDFace *> f = faces;
    std::vector<SDVertex *> v = vertices;
    pstd::pmr::monotonic_buffer_resource resource;
    Allocator vertexFaceAllocator(&resource);

    for (int i = 0; i < nLevels; ++i) {
        // Update _f_ and _v_ for next level of subdivision
        std::vector<SDFace *> newFaces;
        std::vector<SDVertex *> newVertices;

        // Allocate next level of children in mesh tree
        for (SDVertex *vertex : v) {
            vertex->child = vertexFaceAllocator.new_object<SDVertex>();
            vertex->child->regular = vertex->regular;
            vertex->child->boundary = vertex->boundary;
            newVertices.push_back(vertex->child);
        }
        for (SDFace *face : f) {
            for (int k = 0; k < 4; ++k) {
                face->children[k] = vertexFaceAllocator.new_object<SDFace>();
                newFaces.push_back(face->children[k]);
            }
        }

        // Update vertex positions and create new edge vertices

        // Update vertex positions for even vertices
        for (SDVertex *vertex : v) {
            if (!vertex->boundary) {
                // Apply one-ring rule for even vertex
                if (vertex->regular)
                    vertex->child->p = weightOneRing(vertex, 1.f / 16.f);
                else
                    vertex->child->p = weightOneRing(vertex, beta(vertex->valence()));
            } else {
                // Apply boundary rule for even vertex
                vertex->child->p = weightBoundary(vertex, 1.f / 8.f);
            }
        }

        // Compute new odd edge vertices
        std::map<SDEdge, SDVertex *> edgeVerts;
        for (SDFace *face : f) {
            for (int k = 0; k < 3; ++k) {
                // Compute odd vertex on _k_th edge
                SDEdge edge(face->v[k], face->v[NEXT(k)]);
                SDVertex *vert = edgeVerts[edge];
                if (vert == nullptr) {
                    // Create and initialize new odd vertex
                    vert = vertexFaceAllocator.new_object<SDVertex>();
                    newVertices.push_back(vert);
                    vert->regular = true;
                    vert->boundary = (face->f[k] == nullptr);
                    vert->startFace = face->children[3];

                    // Apply edge rules to compute new vertex position
                    if (vert->boundary) {
                        vert->p = 0.5f * edge.v[0]->p;
                        vert->p += 0.5f * edge.v[1]->p;
                    } else {
                        vert->p = 3.f / 8.f * edge.v[0]->p;
                        vert->p += 3.f / 8.f * edge.v[1]->p;
                        vert->p += 1.f / 8.f * face->otherVert(edge.v[0], edge.v[1])->p;
                        vert->p +=
                            1.f / 8.f * face->f[k]->otherVert(edge.v[0], edge.v[1])->p;
                    }
                    edgeVerts[edge] = vert;
                }
            }
        }

        // Update new mesh topology

        // Update even vertex face pointers
        for (SDVertex *vertex : v) {
            int vertNum = vertex->startFace->vnum(vertex);
            vertex->child->startFace = vertex->startFace->children[vertNum];
        }

        // Update face neighbor pointers
        for (SDFace *face : f) {
            for (int j = 0; j < 3; ++j) {
                // Update children _f_ pointers for siblings
                face->children[3]->f[j] = face->children[NEXT(j)];
                face->children[j]->f[NEXT(j)] = face->children[3];

                // Update children _f_ pointers for neighbor children
                SDFace *f2 = face->f[j];
                face->children[j]->f[j] =
                    f2 != nullptr ? f2->children[f2->vnum(face->v[j])] : nullptr;
                f2 = face->f[PREV(j)];
                face->children[j]->f[PREV(j)] =
                    f2 != nullptr ? f2->children[f2->vnum(face->v[j])] : nullptr;
            }
        }

        // Update face vertex pointers
        for (SDFace *face : f) {
            for (int j = 0; j < 3; ++j) {
                // Update child vertex pointer to new even vertex
                face->children[j]->v[j] = face->v[j]->child;

                // Update child vertex pointer to new odd vertex
                SDVertex *vert = edgeVerts[SDEdge(face->v[j], face->v[NEXT(j)])];
                face->children[j]->v[NEXT(j)] = vert;
                face->children[NEXT(j)]->v[j] = vert;
                face->children[3]->v[j] = vert;
            }
        }

        // Prepare for next level of subdivision
        f = newFaces;
        v = newVertices;
    }

    // Push vertices to limit surface
    std::vector<Point3f> pLimit(v.size());
    for (size_t i = 0; i < v.size(); ++i) {
        if (v[i]->boundary)
            pLimit[i] = weightBoundary(v[i], 1.f / 5.f);
        else
            pLimit[i] = weightOneRing(v[i], loopGamma(v[i]->valence()));
    }
    for (size_t i = 0; i < v.size(); ++i)
        v[i]->p = pLimit[i];

    // Compute vertex tangents on limit surface
    std::vector<Normal3f> Ns;
    Ns.reserve(v.size());
    std::vector<Point3f> pRing(16, Point3f());
    for (SDVertex *vertex : v) {
        Vector3f S(0, 0, 0), T(0, 0, 0);
        int valence = vertex->valence();
        if (valence > (int)pRing.size())
            pRing.resize(valence);
        vertex->oneRing(&pRing[0]);
        if (!vertex->boundary) {
            // Compute tangents of interior face
            for (int j = 0; j < valence; ++j) {
                S += std::cos(2 * Pi * j / valence) * Vector3f(pRing[j]);
                T += std::sin(2 * Pi * j / valence) * Vector3f(pRing[j]);
            }
        } else {
            // Compute tangents of boundary face
            S = pRing[valence - 1] - pRing[0];
            if (valence == 2)
                T = Vector3f(pRing[0] + pRing[1] - 2 * vertex->p);
            else if (valence == 3)
                T = pRing[1] - vertex->p;
            else if (valence == 4)  // regular
                T = Vector3f(-1 * pRing[0] + 2 * pRing[1] + 2 * pRing[2] + -1 * pRing[3] +
                             -2 * vertex->p);
            else {
                Float theta = Pi / float(valence - 1);
                T = Vector3f(std::sin(theta) * (pRing[0] + pRing[valence - 1]));
                for (int k = 1; k < valence - 1; ++k) {
                    Float wt = (2 * std::cos(theta) - 2) * std::sin((k)*theta);
                    T += Vector3f(wt * pRing[k]);
                }
                T = -T;
            }
        }
        Ns.push_back(Normal3f(Cross(S, T)));
    }

    // Create triangle mesh from subdivision mesh
    {
        size_t ntris = f.size();
        std::vector<int> verts(3 * ntris);
        int *vp = verts.data();
        size_t totVerts = v.size();
        std::map<SDVertex *, int> usedVerts;
        for (size_t i = 0; i < totVerts; ++i)
            usedVerts[v[i]] = i;
        for (size_t i = 0; i < ntris; ++i) {
            for (int j = 0; j < 3; ++j) {
                *vp = usedVerts[f[i]->v[j]];
                ++vp;
            }
        }
        return alloc.new_object<TriangleMesh>(*renderFromObject, reverseOrientation,
                                              verts, pLimit, std::vector<Vector3f>(), Ns,
                                              std::vector<Point2f>(), std::vector<int>());
    }
}